

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
MuteIRCCommand::trigger
          (MuteIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  PlayerInfo *pPVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  size_t local_78;
  char *local_70;
  size_t local_68;
  time_point local_60;
  size_type local_50;
  undefined8 local_40;
  char *local_38;
  
  pcVar7 = nick._M_str;
  sVar6 = nick._M_len;
  if (parameters._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,sVar6,pcVar7,0x30,"Error: Too Few Parameters. Syntax: mute <player>");
    return;
  }
  lVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
  if (lVar2 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    RenX::getCore();
    lVar2 = RenX::Core::getServerCount();
    if (lVar2 != 0) {
      local_68 = parameters._M_len;
      uVar5 = 1;
      bVar9 = false;
      local_78 = channel._M_len;
      local_70 = channel._M_str;
      do {
        uVar3 = RenX::getCore();
        pPVar4 = (PlayerInfo *)RenX::Core::getServer(uVar3);
        cVar1 = RenX::Server::isLogChanType((int)pPVar4);
        if (cVar1 != '\0') {
          lVar2 = RenX::Server::getPlayerByPartName(pPVar4,local_68,parameters._M_str);
          if (lVar2 == 0) {
            parameters._M_len = 0x18;
            Jupiter::IRC::Client::sendNotice(source,sVar6,pcVar7,0x18,"Error: Player not found.");
          }
          else {
            RenX::Server::mute(pPVar4);
            RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)&stack0xffffffffffffffa0);
            local_40 = 0x11;
            local_38 = "\x03 has been muted.";
            jessilib::
            join<std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                      (&local_98,(jessilib *)&stack0xffffffffffffffa0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffffc0,
                       (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len);
            parameters._M_len = local_98._M_string_length;
            Jupiter::IRC::Client::sendMessage
                      (source,local_78,local_70,local_98._M_string_length,local_98._M_dataplus._M_p)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if (local_60.__d.__r != (duration)&stack0xffffffffffffffb0) {
              operator_delete((void *)local_60.__d.__r,local_50 + 1);
            }
          }
          bVar9 = true;
        }
        uVar8 = (ulong)uVar5;
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar8);
      if (bVar9) {
        return;
      }
    }
    Jupiter::IRC::Client::sendNotice
              (source,sVar6,pcVar7,0x40,
               "Error: Channel not attached to any connected Renegade X servers.");
  }
  return;
}

Assistant:

void MuteIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			int type = chan->getType();
			RenX::PlayerInfo *player;
			bool match = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					match = true;
					player = server->getPlayerByPartName(parameters);
					if (player != nullptr)
					{
						server->mute(*player);
						source->sendMessage(channel, jessilib::join<std::string>(RenX::getFormattedPlayerName(*player), IRCCOLOR " has been muted."sv));
					}
					else
						source->sendNotice(nick, "Error: Player not found."sv);
				}
			}
			if (match == false)
				source->sendNotice(nick, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: mute <player>"sv);
}